

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_io.c
# Opt level: O0

int unix_read_func(void *conn,void *buffer,size_t length,int *errno_p,char **result_p)

{
  int iVar1;
  ssize_t sVar2;
  int *piVar3;
  int *in_RCX;
  size_t in_RDX;
  void *in_RSI;
  int in_EDI;
  undefined8 *in_R8;
  int lerrno_1;
  int lerrno;
  int fd;
  int iget;
  int left;
  int local_38;
  int local_34;
  int local_4;
  
  sVar2 = read(in_EDI,in_RSI,in_RDX);
  local_38 = (int)sVar2;
  if (local_38 == 0) {
    if (in_R8 != (undefined8 *)0x0) {
      *in_R8 = "End of file";
    }
    if (in_RCX != (int *)0x0) {
      *in_RCX = 0;
    }
    local_4 = 0;
  }
  else {
    if (local_38 == -1) {
      piVar3 = __errno_location();
      iVar1 = *piVar3;
      if (in_RCX != (int *)0x0) {
        *in_RCX = iVar1;
      }
      if (((iVar1 != 0xb) && (iVar1 != 0xb)) && (iVar1 != 4)) {
        return -1;
      }
      if (in_RCX != (int *)0x0) {
        *in_RCX = 0;
      }
      local_38 = 0;
    }
    local_4 = (int)in_RDX;
    for (local_34 = local_4 - local_38; 0 < local_34; local_34 = local_34 - local_38) {
      sVar2 = read(in_EDI,(void *)((long)in_RSI + (in_RDX - (long)local_34)),(long)local_34);
      local_38 = (int)sVar2;
      if (local_38 == 0) {
        if (in_R8 != (undefined8 *)0x0) {
          *in_R8 = "End of file";
        }
        if (in_RCX != (int *)0x0) {
          *in_RCX = 0;
        }
        return local_4 - local_34;
      }
      if (local_38 == -1) {
        piVar3 = __errno_location();
        iVar1 = *piVar3;
        if (in_RCX != (int *)0x0) {
          piVar3 = __errno_location();
          *in_RCX = *piVar3;
        }
        if (((iVar1 != 0xb) && (iVar1 != 0xb)) && (iVar1 != 4)) {
          return local_4 - local_34;
        }
        if (in_RCX != (int *)0x0) {
          *in_RCX = 0;
        }
        local_38 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int
unix_read_func(void *conn, void *buffer, size_t length, int *errno_p, char **result_p)
{
    int left = length;
    int iget;
    int fd = (int) (long) conn;

    iget = read(fd, (char *) buffer, length);
    if (iget == 0) {
	if (result_p) *result_p = "End of file";
	if (errno_p) *errno_p = 0;
	return 0;		/* end of file */
    } else if (iget == -1) {
	int lerrno = errno;
	if (errno_p) *errno_p = lerrno;
	if ((lerrno != EWOULDBLOCK) &&
	    (lerrno != EAGAIN) &&
	    (lerrno != EINTR)) {
	    /* serious error */
	    return -1;
	} else {
	    if (errno_p) *errno_p = 0;
	    iget = 0;
	}
    }
    left = length - iget;
    while (left > 0) {
	iget = read(fd, (char *) buffer + length - left, left);
	if (iget == 0) {
	    if (result_p) *result_p = "End of file";
	    if (errno_p) *errno_p = 0;
	    return length - left;	/* end of file */
	} else if (iget == -1) {
	    int lerrno = errno;
	    if (errno_p) *errno_p = errno;
	    if ((lerrno != EWOULDBLOCK) &&
		(lerrno != EAGAIN) &&
		(lerrno != EINTR)) {
		/* serious error */
		return (length - left);
	    } else {
		if (errno_p) *errno_p = 0;
		iget = 0;
	    }
	}
	left -= iget;
    }
    return length;
}